

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O2

int QStyle::sliderPositionFromValue(int min,int max,int logicalValue,int span,bool upsideDown)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = max - min;
  iVar1 = 0;
  if ((uVar2 != 0 && min <= max) && 0 < span) {
    if (logicalValue < min) {
      iVar1 = 0;
      if (upsideDown) {
        iVar1 = span;
      }
      return iVar1;
    }
    if (max < logicalValue) {
      if (upsideDown) {
        span = 0;
      }
      return span;
    }
    uVar3 = logicalValue - min;
    if (upsideDown) {
      uVar3 = max - logicalValue;
    }
    if (0x7ffff < uVar2) {
      return (int)((double)uVar3 / ((double)uVar2 / (double)span));
    }
    if ((uint)span < uVar2) {
      return (uVar2 + span * uVar3 * 2) / (uVar2 * 2);
    }
    iVar1 = (uVar2 + ((uint)span % uVar2) * uVar3 * 2) / (uVar2 * 2) + ((uint)span / uVar2) * uVar3;
  }
  return iVar1;
}

Assistant:

int QStyle::sliderPositionFromValue(int min, int max, int logicalValue, int span, bool upsideDown)
{
    if (span <= 0 || max <= min)
        return 0;
    if (logicalValue < min)
        return upsideDown ? span : 0;
    if (logicalValue > max)
        return upsideDown ? 0 : span;

    const uint range = qint64(max) - min;
    const uint p = upsideDown ? qint64(max) - logicalValue : qint64(logicalValue) - min;

    if (range > (uint)INT_MAX/4096) {
        double dpos = (double(p))/(double(range)/span);
        return int(dpos);
    } else if (q20::cmp_greater(range, span)) {
        return (2 * p * span + range) / (2*range);
    } else {
        uint div = span / range;
        uint mod = span % range;
        return p * div + (2 * p * mod + range) / (2 * range);
    }
    // equiv. to (p * span) / range + 0.5
    // no overflow because of this implicit assumption:
    // span <= 4096
}